

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkAig.c
# Opt level: O3

Nwk_Man_t *
Nwk_ManCreateFromGia
          (Gia_Man_t *p,Vec_Int_t *vPPis,Vec_Int_t *vNodes,Vec_Int_t *vLeaves,Vec_Int_t **pvMapInv)

{
  int iVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Nwk_Man_t *p_00;
  size_t sVar4;
  char *__dest;
  Vec_Int_t *p_01;
  int *piVar5;
  undefined8 *__ptr;
  Nwk_Obj_t *pNVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  
  Gia_ManCreateRefs(p);
  piVar5 = (int *)0x0;
  p_00 = Nwk_ManAlloc();
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p_00->nFanioPlus = 0;
  Hop_ManStop(p_00->pManHop);
  p_00->pManHop = (Hop_Man_t *)0x0;
  iVar10 = vNodes->nSize;
  iVar11 = vPPis->nSize;
  iVar1 = vLeaves->nSize;
  iVar8 = iVar1;
  if (iVar1 < iVar11) {
    iVar8 = iVar11;
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < (uint)(iVar8 + iVar10)) {
    iVar9 = iVar8 + iVar10 + 1;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar9;
  if (iVar9 != 0) {
    piVar5 = (int *)malloc((long)iVar9 << 2);
  }
  p_01->pArray = piVar5;
  iVar10 = p->nObjs;
  __ptr = (undefined8 *)malloc((long)iVar10 * 8);
  if (0 < (long)iVar10) {
    pGVar2 = p->pObjs;
    iVar10 = iVar1 - iVar11;
    if (iVar10 == 0 || iVar1 < iVar11) {
      iVar10 = 0;
    }
    pNVar6 = Nwk_ManCreateNode(p_00,0,iVar10 + *p->pRefs);
    pGVar3 = p->pObjs;
    if ((pGVar3 <= pGVar2) && (pGVar2 < pGVar3 + p->nObjs)) {
      iVar10 = (int)((long)pGVar2 - (long)pGVar3 >> 2) * -0x55555555;
      __ptr[iVar10] = pNVar6;
      Vec_IntPush(p_01,iVar10);
      uVar15 = (ulong)(uint)vLeaves->nSize;
      if (0 < vLeaves->nSize) {
        lVar13 = 0;
        do {
          lVar7 = (long)vLeaves->pArray[lVar13];
          if ((lVar7 < 0) || (p->nObjs <= vLeaves->pArray[lVar13])) goto LAB_00496be1;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + lVar7;
          pNVar6 = Nwk_ManCreateCi(p_00,p->pRefs[lVar7]);
          pGVar3 = p->pObjs;
          if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) goto LAB_00496bc2;
          iVar10 = (int)((long)pGVar2 - (long)pGVar3 >> 2) * -0x55555555;
          __ptr[iVar10] = pNVar6;
          if (p_01->nSize != pNVar6->Id) {
            __assert_fail("Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)])",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                          ,0xb1,
                          "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                         );
          }
          Vec_IntPush(p_01,iVar10);
          lVar13 = lVar13 + 1;
          uVar15 = (ulong)vLeaves->nSize;
        } while (lVar13 < (long)uVar15);
      }
      uVar12 = vPPis->nSize;
      if ((int)uVar15 < (int)uVar12) {
        do {
          Nwk_ManCreateCi(p_00,0);
          Vec_IntPush(p_01,-1);
          uVar14 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar14;
          uVar12 = vPPis->nSize;
        } while ((int)uVar14 < (int)uVar12);
      }
      if (0 < vNodes->nSize) {
        lVar13 = 0;
        do {
          lVar7 = (long)vNodes->pArray[lVar13];
          if ((lVar7 < 0) || (p->nObjs <= vNodes->pArray[lVar13])) goto LAB_00496be1;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + lVar7;
          pNVar6 = Nwk_ManCreateNode(p_00,2,p->pRefs[lVar7]);
          pGVar3 = p->pObjs;
          if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) goto LAB_00496bc2;
          iVar10 = (int)((long)pGVar2 - (long)pGVar3 >> 2) * -0x55555555;
          __ptr[iVar10] = pNVar6;
          Nwk_ObjAddFanin(pNVar6,(Nwk_Obj_t *)__ptr[(int)(iVar10 - (*(uint *)pGVar2 & 0x1fffffff))])
          ;
          pGVar3 = p->pObjs;
          if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) goto LAB_00496bc2;
          iVar10 = (int)((long)pGVar2 - (long)pGVar3 >> 2) * -0x55555555;
          Nwk_ObjAddFanin((Nwk_Obj_t *)__ptr[iVar10],
                          (Nwk_Obj_t *)
                          __ptr[(int)(iVar10 - (*(uint *)&pGVar2->field_0x4 & 0x1fffffff))]);
          pGVar3 = p->pObjs;
          if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) goto LAB_00496bc2;
          iVar10 = (int)((long)pGVar2 - (long)pGVar3 >> 2) * -0x55555555;
          if (p_01->nSize != *(int *)(__ptr[iVar10] + 0x24)) {
            __assert_fail("Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)])",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                          ,0xbe,
                          "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                         );
          }
          Vec_IntPush(p_01,iVar10);
          lVar13 = lVar13 + 1;
        } while (lVar13 < vNodes->nSize);
        uVar12 = vPPis->nSize;
      }
      uVar15 = (ulong)uVar12;
      if (0 < (int)uVar12) {
        lVar13 = 0;
        do {
          lVar7 = (long)vPPis->pArray[lVar13];
          if ((lVar7 < 0) || (p->nObjs <= vPPis->pArray[lVar13])) {
LAB_00496be1:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (__ptr[lVar7] == 0) {
            __assert_fail("ppCopies[Gia_ObjId(p,pObj)] != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                          ,0xc3,
                          "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                         );
          }
          pGVar2 = p->pObjs + lVar7;
          pNVar6 = Nwk_ManCreateCo(p_00);
          pGVar3 = p->pObjs;
          if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) goto LAB_00496bc2;
          Nwk_ObjAddFanin(pNVar6,(Nwk_Obj_t *)
                                 __ptr[(int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) *
                                       -0x55555555]);
          lVar13 = lVar13 + 1;
          uVar15 = (ulong)vPPis->nSize;
        } while (lVar13 < (long)uVar15);
      }
      iVar10 = vLeaves->nSize;
      iVar11 = (int)uVar15;
      if (iVar11 < iVar10) {
        do {
          pNVar6 = Nwk_ManCreateCo(p_00);
          Nwk_ObjAddFanin(pNVar6,(Nwk_Obj_t *)*__ptr);
          uVar12 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar12;
          iVar10 = vLeaves->nSize;
        } while ((int)uVar12 < iVar10);
        iVar11 = vPPis->nSize;
      }
      if (iVar10 < iVar11) {
        iVar10 = iVar11;
      }
      if (p_01->nSize != iVar10 + vNodes->nSize + 1) {
        __assert_fail("Vec_IntSize(vMaps) == Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                      ,200,
                      "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                     );
      }
      if (__ptr != (undefined8 *)0x0) {
        free(__ptr);
      }
      *pvMapInv = p_01;
      return p_00;
    }
  }
LAB_00496bc2:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Nwk_Man_t * Nwk_ManCreateFromGia( Gia_Man_t * p, Vec_Int_t * vPPis, Vec_Int_t * vNodes, Vec_Int_t * vLeaves, Vec_Int_t ** pvMapInv )
{
    Nwk_Man_t * pNtk;
    Nwk_Obj_t ** ppCopies;
    Gia_Obj_t * pObj;
    Vec_Int_t * vMaps;
    int i;
//    assert( Vec_IntSize(vLeaves) >= Vec_IntSize(vPPis) );
    Gia_ManCreateRefs( p );
    pNtk = Nwk_ManAlloc();
    pNtk->pName = Abc_UtilStrsav( p->pName );
    pNtk->nFanioPlus = 0;
    Hop_ManStop( pNtk->pManHop );
    pNtk->pManHop = NULL;
    // allocate
    vMaps = Vec_IntAlloc( Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1 );
    ppCopies = ABC_ALLOC( Nwk_Obj_t *, Gia_ManObjNum(p) );
    // copy objects
    pObj = Gia_ManConst0(p);
//    ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 0, Gia_ObjRefNum(p,pObj) );
    ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 0, Gia_ObjRefNum(p,pObj) + (Vec_IntSize(vLeaves) > Vec_IntSize(vPPis) ? Vec_IntSize(vLeaves) - Vec_IntSize(vPPis) : 0) );
    Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateCi( pNtk, Gia_ObjRefNum(p,pObj) );
        assert( Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)]) );
        Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    }
    for ( i = Vec_IntSize(vLeaves); i < Vec_IntSize(vPPis); i++ )
    {
        Nwk_ManCreateCi( pNtk, 0 );
        Vec_IntPush( vMaps, -1 );
    }
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 2, Gia_ObjRefNum(p,pObj) );
        Nwk_ObjAddFanin( ppCopies[Gia_ObjId(p,pObj)], ppCopies[Gia_ObjFaninId0p(p,pObj)] );
        Nwk_ObjAddFanin( ppCopies[Gia_ObjId(p,pObj)], ppCopies[Gia_ObjFaninId1p(p,pObj)] );
        assert( Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)]) );
        Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    }
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
    {
        assert( ppCopies[Gia_ObjId(p,pObj)] != NULL );
        Nwk_ObjAddFanin( Nwk_ManCreateCo(pNtk), ppCopies[Gia_ObjId(p,pObj)] );
    }
    for ( i = Vec_IntSize(vPPis); i < Vec_IntSize(vLeaves); i++ )
        Nwk_ObjAddFanin( Nwk_ManCreateCo(pNtk), ppCopies[0] );
    assert( Vec_IntSize(vMaps) == Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1 );
    ABC_FREE( ppCopies );
    *pvMapInv = vMaps;
    return pNtk;
}